

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fProgramInterfaceQueryTestCase.cpp
# Opt level: O0

string * __thiscall
deqp::gles31::Functional::(anonymous_namespace)::PropValidator::
getHumanReadablePropertyString_abi_cxx11_(string *__return_storage_ptr__,void *this,GLint propVal)

{
  GLint local_1c;
  void *pvStack_18;
  GLint propVal_local;
  PropValidator *this_local;
  
  local_1c = propVal;
  pvStack_18 = this;
  this_local = (PropValidator *)__return_storage_ptr__;
  de::toString<int>(__return_storage_ptr__,&local_1c);
  return __return_storage_ptr__;
}

Assistant:

std::string PropValidator::getHumanReadablePropertyString (glw::GLint propVal) const
{
	return de::toString(propVal);
}